

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O0

void __thiscall cmDocumentationSection::Prepend(cmDocumentationSection *this,char *(*data) [2])

{
  iterator __first;
  iterator __last;
  __normal_iterator<cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
  local_58;
  const_iterator local_50;
  int local_34;
  undefined1 local_30 [4];
  int i;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> tmp;
  char *(*data_local) [2];
  cmDocumentationSection *this_local;
  
  tmp.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::vector
            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_30);
  local_34 = 0;
  while ((&((tmp.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->Name)._M_string_length)
         [(long)local_34 * 2] != 0) {
    std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
    emplace_back<char_const*&,char_const*&>
              ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)local_30,
               (char **)(&((tmp.
                            super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->Name)._M_dataplus +
                        (long)local_34 * 0x10),
               (char **)(&((tmp.
                            super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->Name).
                          _M_string_length + (long)local_34 * 2));
    tmp.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)&((tmp.
                     super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->Name).field_2;
  }
  local_58._M_current =
       (cmDocumentationEntry *)
       std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::begin
                 (&this->Entries);
  __gnu_cxx::
  __normal_iterator<cmDocumentationEntry_const*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>
  ::__normal_iterator<cmDocumentationEntry*>
            ((__normal_iterator<cmDocumentationEntry_const*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>
              *)&local_50,&local_58);
  __first = std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::begin
                      ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
                       local_30);
  __last = std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::end
                     ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
                      local_30);
  std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
  insert<__gnu_cxx::__normal_iterator<cmDocumentationEntry*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>,void>
            ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&this->Entries,
             local_50,(__normal_iterator<cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
                       )__first._M_current,
             (__normal_iterator<cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
              )__last._M_current);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_30);
  return;
}

Assistant:

void cmDocumentationSection::Prepend(const char* data[][2])
{
  std::vector<cmDocumentationEntry> tmp;
  int i = 0;
  while (data[i][1]) {
    tmp.emplace_back(data[i][0], data[i][1]);
    data += 1;
  }
  this->Entries.insert(this->Entries.begin(), tmp.begin(), tmp.end());
}